

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

Vector3d * ear::toCartesianVector3d(PolarPosition position)

{
  Vector3d *in_RDI;
  double in_stack_00000008;
  
  cart(in_RDI,in_stack_00000008,position.azimuth,position.elevation);
  return in_RDI;
}

Assistant:

Eigen::Vector3d toCartesianVector3d(PolarPosition position) {
    return cart(position.azimuth, position.elevation, position.distance);
  }